

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O3

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::delay_allowed
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vloc_t *vloc)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<unsigned_long> local_31;
  
  uVar3 = (ulong)(vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>.
                 _capacity;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)r->_refcount,0,&local_31);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(__return_storage_ptr__);
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      if ((vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>._capacity
          <= (uint)uVar2) {
LAB_001a953d:
        __assert_fail("i < BASE::_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                      ,0xfd,
                      "const T &tchecker::make_array_t<unsigned int, 4, tchecker::vloc_base_t>::operator[](typename BASE::capacity_t) const [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vloc_base_t]"
                     );
      }
      bVar1 = system_t::is_urgent(system,(loc_id_t)(&(vloc->super_loc_array_t)._fam)[uVar2]);
      if (bVar1) {
LAB_001a9514:
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                  (__return_storage_ptr__,
                   (ulong)(r->_procmap).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar2]);
      }
      else {
        if ((vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>.
            _capacity <= (uint)uVar2) goto LAB_001a953d;
        bVar1 = syncprod::system_t::is_committed
                          (&system->super_system_t,
                           (loc_id_t)(&(vloc->super_loc_array_t)._fam)[uVar2]);
        if (bVar1) goto LAB_001a9514;
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> delay_allowed(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                      tchecker::vloc_t const & vloc)
{
  std::size_t const size = vloc.size();
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> allowed{r.refcount()};
  allowed.set();
  for (std::size_t i = 0; i < size; ++i)
    if (system.is_urgent(vloc[i]) || system.is_committed(vloc[i]))
      allowed.reset(procmap[i]);
  return allowed;
}